

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RowSetInsert(RowSet *p,i64 rowid)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry **ppRVar3;
  
  pRVar2 = rowSetEntryAlloc(p);
  if (pRVar2 != (RowSetEntry *)0x0) {
    pRVar2->v = rowid;
    pRVar2->pRight = (RowSetEntry *)0x0;
    pRVar1 = p->pLast;
    if (pRVar1 == (RowSetEntry *)0x0) {
      ppRVar3 = &p->pEntry;
    }
    else {
      if (rowid <= pRVar1->v) {
        *(byte *)&p->rsFlags = (byte)p->rsFlags & 0xfe;
      }
      ppRVar3 = &pRVar1->pRight;
    }
    *ppRVar3 = pRVar2;
    p->pLast = pRVar2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RowSetInsert(RowSet *p, i64 rowid){
  struct RowSetEntry *pEntry;  /* The new entry */
  struct RowSetEntry *pLast;   /* The last prior entry */

  /* This routine is never called after sqlite3RowSetNext() */
  assert( p!=0 && (p->rsFlags & ROWSET_NEXT)==0 );

  pEntry = rowSetEntryAlloc(p);
  if( pEntry==0 ) return;
  pEntry->v = rowid;
  pEntry->pRight = 0;
  pLast = p->pLast;
  if( pLast ){
    if( rowid<=pLast->v ){  /*OPTIMIZATION-IF-FALSE*/
      /* Avoid unnecessary sorts by preserving the ROWSET_SORTED flags
      ** where possible */
      p->rsFlags &= ~ROWSET_SORTED;
    }
    pLast->pRight = pEntry;
  }else{
    p->pEntry = pEntry;
  }
  p->pLast = pEntry;
}